

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O2

void __thiscall crnlib::semaphore::release(semaphore *this,long releaseCount)

{
  int iVar1;
  long lVar2;
  
  lVar2 = releaseCount + 1;
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 < 1) {
      return;
    }
    iVar1 = sem_post((sem_t *)this);
  } while (iVar1 == 0);
  crnlib_fail("\"semaphore: sem_post() or sem_post_multiple() failed\"",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_threading_pthreads.cpp"
              ,0xb3);
  return;
}

Assistant:

void semaphore::release(long releaseCount)
    {
        CRNLIB_ASSERT(releaseCount >= 1);

        int status = 0;
#ifdef WIN32
        if (1 == releaseCount)
        {
            status = sem_post(&m_sem);
        }
        else
        {
            status = sem_post_multiple(&m_sem, releaseCount);
        }
#else
        while (releaseCount > 0)
        {
            status = sem_post(&m_sem);
            if (status)
            {
                break;
            }
            releaseCount--;
        }
#endif

        if (status)
        {
            CRNLIB_FAIL("semaphore: sem_post() or sem_post_multiple() failed");
        }
    }